

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

int mbedtls_entropy_self_test(int verbose)

{
  ulong local_4a8;
  size_t j;
  size_t i;
  uchar acc [64];
  uchar buf [64];
  undefined1 local_410 [8];
  mbedtls_entropy_context ctx;
  int ret;
  int verbose_local;
  
  ctx.source[0x13].strong = 0;
  ctx.source[0x13]._36_4_ = verbose;
  memset(acc + 0x38,0,0x40);
  memset(&i,0,0x40);
  if (ctx.source[0x13]._36_4_ != 0) {
    printf("  ENTROPY test: ");
  }
  mbedtls_entropy_init((mbedtls_entropy_context *)local_410);
  ctx.source[0x13].strong = mbedtls_entropy_gather((mbedtls_entropy_context *)local_410);
  if (((ctx.source[0x13].strong == 0) &&
      (ctx.source[0x13].strong =
            mbedtls_entropy_add_source
                      ((mbedtls_entropy_context *)local_410,entropy_dummy_source,(void *)0x0,0x10,0)
      , ctx.source[0x13].strong == 0)) &&
     (ctx.source[0x13].strong =
           mbedtls_entropy_update_manual((mbedtls_entropy_context *)local_410,acc + 0x38,0x40),
     ctx.source[0x13].strong == 0)) {
    for (j = 0; j < 8; j = j + 1) {
      ctx.source[0x13].strong = mbedtls_entropy_func(local_410,acc + 0x38,0x40);
      if (ctx.source[0x13].strong != 0) goto LAB_0014c837;
      for (local_4a8 = 0; local_4a8 < 0x40; local_4a8 = local_4a8 + 1) {
        acc[local_4a8 - 8] = acc[local_4a8 - 8] | acc[local_4a8 + 0x38];
      }
    }
    for (local_4a8 = 0; local_4a8 < 0x40; local_4a8 = local_4a8 + 1) {
      if (acc[local_4a8 - 8] == '\0') {
        ctx.source[0x13].strong = 1;
        break;
      }
    }
  }
LAB_0014c837:
  mbedtls_entropy_free((mbedtls_entropy_context *)local_410);
  if (ctx.source[0x13]._36_4_ != 0) {
    if (ctx.source[0x13].strong == 0) {
      printf("passed\n");
    }
    else {
      printf("failed\n");
    }
    printf(anon_var_dwarf_66e7a + 8);
  }
  return (int)(ctx.source[0x13].strong != 0);
}

Assistant:

int mbedtls_entropy_self_test( int verbose )
{
    int ret = 0;
    mbedtls_entropy_context ctx;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE] = { 0 };
    unsigned char acc[MBEDTLS_ENTROPY_BLOCK_SIZE] = { 0 };
    size_t i, j;

    if( verbose != 0 )
        mbedtls_printf( "  ENTROPY test: " );

    mbedtls_entropy_init( &ctx );

    /* First do a gather to make sure we have default sources */
    if( ( ret = mbedtls_entropy_gather( &ctx ) ) != 0 )
        goto cleanup;

    ret = mbedtls_entropy_add_source( &ctx, entropy_dummy_source, NULL, 16,
                                      MBEDTLS_ENTROPY_SOURCE_WEAK );
    if( ret != 0 )
        goto cleanup;

    if( ( ret = mbedtls_entropy_update_manual( &ctx, buf, sizeof buf ) ) != 0 )
        goto cleanup;

    /*
     * To test that mbedtls_entropy_func writes correct number of bytes:
     * - use the whole buffer and rely on ASan to detect overruns
     * - collect entropy 8 times and OR the result in an accumulator:
     *   any byte should then be 0 with probably 2^(-64), so requiring
     *   each of the 32 or 64 bytes to be non-zero has a false failure rate
     *   of at most 2^(-58) which is acceptable.
     */
    for( i = 0; i < 8; i++ )
    {
        if( ( ret = mbedtls_entropy_func( &ctx, buf, sizeof( buf ) ) ) != 0 )
            goto cleanup;

        for( j = 0; j < sizeof( buf ); j++ )
            acc[j] |= buf[j];
    }

    for( j = 0; j < sizeof( buf ); j++ )
    {
        if( acc[j] == 0 )
        {
            ret = 1;
            goto cleanup;
        }
    }

cleanup:
    mbedtls_entropy_free( &ctx );

    if( verbose != 0 )
    {
        if( ret != 0 )
            mbedtls_printf( "failed\n" );
        else
            mbedtls_printf( "passed\n" );

        mbedtls_printf( "\n" );
    }

    return( ret != 0 );
}